

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<bool> __thiscall
deqp::gls::BuiltinPrecisionTests::exprP<bool>(BuiltinPrecisionTests *this,Expr<bool> *ptr)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<bool> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_> local_20;
  
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>::SharedPtr(&local_20,ptr);
  exprP<bool>(this,&local_20);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>::release(&local_20);
  EVar1.super_ExprPBase<bool>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>.
  m_state = extraout_RDX;
  EVar1.super_ExprPBase<bool>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>.
  m_ptr = (Expr<bool> *)this;
  return (ExprP<bool>)
         EVar1.super_ExprPBase<bool>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>;
}

Assistant:

ExprP<T> exprP (const Expr<T>* ptr)
{
	return exprP(SharedPtr<const Expr<T> >(ptr));
}